

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.cpp
# Opt level: O3

int llex(LexState *ls,SemInfo *seminfo)

{
  char cVar1;
  char cVar2;
  ZIO *pZVar3;
  byte *pbVar4;
  SemInfo *pSVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  TString *pTVar10;
  size_t sVar11;
  lconv *plVar12;
  long lVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  uint local_44 [3];
  SemInfo *local_38;
  
  ls->buff->n = 0;
  while( true ) {
    uVar7 = ls->current;
    uVar16 = (ulong)(int)uVar7;
    if (0x5a < (long)uVar16) break;
    switch(uVar7) {
    case 9:
    case 0xb:
    case 0xc:
    case 0x20:
      pZVar3 = ls->z;
      sVar11 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar11 == 0) {
        uVar7 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar7 = (uint)*pbVar4;
      }
      ls->current = uVar7;
      break;
    case 10:
    case 0xd:
      inclinenumber(ls);
      break;
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x21:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2f:
    case 0x3b:
      goto switchD_00114e33_caseD_e;
    case 0x22:
    case 0x27:
      local_38 = seminfo;
      save(ls,uVar7);
      pZVar3 = ls->z;
      sVar11 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar11 == 0) {
        uVar6 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar6 = (uint)*pbVar4;
      }
      ls->current = uVar6;
      goto joined_r0x001150a8;
    case 0x2d:
      pZVar3 = ls->z;
      sVar11 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar11 == 0) {
        uVar7 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar7 = (uint)*pbVar4;
      }
      ls->current = uVar7;
      if (uVar7 != 0x2d) {
        return 0x2d;
      }
      pZVar3 = ls->z;
      sVar11 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar11 == 0) {
        uVar7 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar7 = (uint)*pbVar4;
      }
      ls->current = uVar7;
      if (uVar7 == 0x5b) {
        iVar9 = skip_sep(ls);
        ls->buff->n = 0;
        if (iVar9 < 0) {
          uVar7 = ls->current;
          goto LAB_00114f10;
        }
        read_long_string(ls,(SemInfo *)0x0,iVar9);
        ls->buff->n = 0;
      }
      else {
LAB_00114f10:
        while ((0xe < uVar7 + 1 || ((0x4801U >> (uVar7 + 1 & 0x1f) & 1) == 0))) {
          pZVar3 = ls->z;
          sVar11 = pZVar3->n;
          pZVar3->n = pZVar3->n - 1;
          if (sVar11 == 0) {
            uVar7 = luaZ_fill(pZVar3);
          }
          else {
            pbVar4 = (byte *)pZVar3->p;
            pZVar3->p = (char *)(pbVar4 + 1);
            uVar7 = (uint)*pbVar4;
          }
          ls->current = uVar7;
        }
      }
      break;
    case 0x2e:
      save(ls,0x2e);
      pZVar3 = ls->z;
      sVar11 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar11 == 0) {
        uVar7 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar7 = (uint)*pbVar4;
      }
      ls->current = uVar7;
      iVar9 = check_next(ls,".");
      if (iVar9 != 0) {
        iVar9 = check_next(ls,".");
        return 0x118 - (uint)(iVar9 == 0);
      }
      uVar7 = ls->current;
      if ((""[(long)(int)uVar7 + 1] & 2) == 0) {
        return 0x2e;
      }
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      save(ls,uVar7);
      pZVar3 = ls->z;
      sVar11 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar11 == 0) {
        uVar6 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar6 = (uint)*pbVar4;
      }
      ls->current = uVar6;
      if (uVar7 == 0x30) {
        iVar9 = check_next(ls,"Xx");
        pcVar14 = "Pp";
        if (iVar9 == 0) {
          pcVar14 = "Ee";
        }
      }
      else {
        pcVar14 = "Ee";
      }
      while( true ) {
        iVar9 = check_next(ls,pcVar14);
        if (iVar9 != 0) {
          check_next(ls,"+-");
        }
        iVar9 = ls->current;
        if (((long)iVar9 != 0x2e) && ((""[(long)iVar9 + 1] & 0x10) == 0)) break;
        save(ls,iVar9);
        pZVar3 = ls->z;
        sVar11 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar11 == 0) {
          uVar7 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar7 = (uint)*pbVar4;
        }
        ls->current = uVar7;
      }
      save(ls,0);
      pcVar14 = ls->buff->buffer;
      sVar11 = ls->buff->n;
      if (sVar11 == 0) {
        sVar11 = 0xffffffffffffffff;
      }
      else {
        cVar1 = ls->decpoint;
        do {
          if (pcVar14[sVar11 - 1] == '.') {
            pcVar14[sVar11 - 1] = cVar1;
          }
          sVar11 = sVar11 - 1;
        } while (sVar11 != 0);
        pcVar14 = ls->buff->buffer;
        sVar11 = ls->buff->n - 1;
      }
      iVar9 = luaO_str2d(pcVar14,sVar11,&seminfo->r);
      if (iVar9 != 0) {
        return 0x11f;
      }
      cVar1 = ls->decpoint;
      plVar12 = localeconv();
      cVar2 = *plVar12->decimal_point;
      ls->decpoint = cVar2;
      pcVar14 = ls->buff->buffer;
      sVar11 = ls->buff->n;
      if (sVar11 == 0) {
        sVar11 = 0xffffffffffffffff;
      }
      else {
        do {
          if (pcVar14[sVar11 - 1] == cVar1) {
            pcVar14[sVar11 - 1] = cVar2;
          }
          sVar11 = sVar11 - 1;
        } while (sVar11 != 0);
        pcVar14 = ls->buff->buffer;
        sVar11 = ls->buff->n - 1;
      }
      iVar9 = luaO_str2d(pcVar14,sVar11,&seminfo->r);
      if (iVar9 == 0) {
        sVar11 = ls->buff->n;
        if (sVar11 != 0) {
          cVar1 = ls->decpoint;
          pcVar14 = ls->buff->buffer;
          do {
            if (pcVar14[sVar11 - 1] == cVar1) {
              pcVar14[sVar11 - 1] = '.';
            }
            sVar11 = sVar11 - 1;
          } while (sVar11 != 0);
        }
        lexerror(ls,"malformed number",0x11f);
      }
      return 0x11f;
    case 0x3a:
      pZVar3 = ls->z;
      sVar11 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar11 == 0) {
        uVar7 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar7 = (uint)*pbVar4;
      }
      ls->current = uVar7;
      if (uVar7 == 0x3a) {
        pZVar3 = ls->z;
        sVar11 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar11 == 0) {
          uVar7 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar7 = (uint)*pbVar4;
        }
        ls->current = uVar7;
        return 0x11d;
      }
      return 0x3a;
    case 0x3c:
      pZVar3 = ls->z;
      sVar11 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar11 == 0) {
        uVar7 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar7 = (uint)*pbVar4;
      }
      ls->current = uVar7;
      if (uVar7 == 0x3d) {
        pZVar3 = ls->z;
        sVar11 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar11 == 0) {
          uVar7 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar7 = (uint)*pbVar4;
        }
        ls->current = uVar7;
        return 0x11b;
      }
      return 0x3c;
    case 0x3d:
      pZVar3 = ls->z;
      sVar11 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar11 == 0) {
        uVar7 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar7 = (uint)*pbVar4;
      }
      ls->current = uVar7;
      if (uVar7 == 0x3d) {
        pZVar3 = ls->z;
        sVar11 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar11 == 0) {
          uVar7 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar7 = (uint)*pbVar4;
        }
        ls->current = uVar7;
        return 0x119;
      }
      return 0x3d;
    case 0x3e:
      pZVar3 = ls->z;
      sVar11 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar11 == 0) {
        uVar7 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar7 = (uint)*pbVar4;
      }
      ls->current = uVar7;
      if (uVar7 == 0x3d) {
        pZVar3 = ls->z;
        sVar11 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar11 == 0) {
          uVar7 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar7 = (uint)*pbVar4;
        }
        ls->current = uVar7;
        return 0x11a;
      }
      return 0x3e;
    default:
      if (uVar7 == 0xffffffff) {
        return 0x11e;
      }
      goto switchD_00114e33_caseD_e;
    }
  }
  if (uVar7 != 0x5b) {
    if (uVar7 == 0x7e) {
      pZVar3 = ls->z;
      sVar11 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar11 == 0) {
        uVar7 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar7 = (uint)*pbVar4;
      }
      ls->current = uVar7;
      if (uVar7 == 0x3d) {
        pZVar3 = ls->z;
        sVar11 = pZVar3->n;
        pZVar3->n = pZVar3->n - 1;
        if (sVar11 == 0) {
          uVar7 = luaZ_fill(pZVar3);
        }
        else {
          pbVar4 = (byte *)pZVar3->p;
          pZVar3->p = (char *)(pbVar4 + 1);
          uVar7 = (uint)*pbVar4;
        }
        ls->current = uVar7;
        return 0x11c;
      }
      return 0x7e;
    }
switchD_00114e33_caseD_e:
    if ((""[uVar16 + 1] & 1) == 0) {
      pZVar3 = ls->z;
      sVar11 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar11 == 0) {
        uVar6 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar6 = (uint)*pbVar4;
      }
      ls->current = uVar6;
      return uVar7;
    }
    do {
      save(ls,(int)uVar16);
      pZVar3 = ls->z;
      sVar11 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar11 == 0) {
        uVar7 = luaZ_fill(pZVar3);
        uVar16 = (ulong)uVar7;
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar16 = (ulong)*pbVar4;
      }
      ls->current = (int)uVar16;
    } while ((""[(long)(int)uVar16 + 1] & 3) != 0);
    pTVar10 = luaX_newstring(ls,ls->buff->buffer,ls->buff->n);
    seminfo->ts = pTVar10;
    if ((pTVar10->tsv).tt == '\x04') {
      if ((pTVar10->tsv).extra != 0) {
        return (pTVar10->tsv).extra | 0x100;
      }
      return 0x120;
    }
    return 0x120;
  }
  iVar9 = skip_sep(ls);
  if (-1 < iVar9) {
    read_long_string(ls,seminfo,iVar9);
    return 0x121;
  }
  if (iVar9 == -1) {
    return 0x5b;
  }
  pcVar14 = "invalid long string delimiter";
LAB_001157cd:
  lexerror(ls,pcVar14,0x121);
joined_r0x001150a8:
  if (uVar6 == uVar7) {
    save(ls,uVar7);
    pZVar3 = ls->z;
    sVar11 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar11 == 0) {
      uVar7 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar7 = (uint)*pbVar4;
    }
    pSVar5 = local_38;
    ls->current = uVar7;
    pTVar10 = luaX_newstring(ls,ls->buff->buffer + 1,ls->buff->n - 2);
    pSVar5->ts = pTVar10;
    return 0x121;
  }
  if ((int)uVar6 < 0x5c) {
    if (uVar6 == 0xffffffff) {
      lexerror(ls,"unfinished string",0x11e);
    }
    if ((uVar6 == 10) || (uVar6 == 0xd)) {
      pcVar14 = "unfinished string";
      goto LAB_001157cd;
    }
  }
  else if (uVar6 == 0x5c) {
    pZVar3 = ls->z;
    sVar11 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar11 == 0) {
      uVar6 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar6 = (uint)*pbVar4;
    }
    ls->current = uVar6;
    if ((int)uVar6 < 0x62) {
      if ((int)uVar6 < 0x22) {
        if (uVar6 == 0xffffffff) goto joined_r0x001150a8;
        if ((uVar6 != 10) && (uVar6 != 0xd)) goto switchD_0011518c_caseD_6f;
        inclinenumber(ls);
        uVar15 = 10;
      }
      else {
        uVar15 = uVar6;
        if ((int)uVar6 < 0x5c) {
          if ((uVar6 == 0x22) || (uVar6 == 0x27)) goto LAB_00115345;
        }
        else if ((uVar6 == 0x5c) || (uVar15 = 7, uVar6 == 0x61)) goto LAB_00115345;
switchD_0011518c_caseD_6f:
        if ((""[(long)(int)uVar6 + 1] & 2) == 0) {
          escerror(ls,&ls->current,1,"invalid escape sequence");
        }
        lVar13 = 0;
        uVar15 = 0;
        do {
          if ((""[(long)(int)uVar6 + 1] & 2) == 0) goto LAB_001152b0;
          local_44[lVar13] = uVar6;
          pZVar3 = ls->z;
          sVar11 = pZVar3->n;
          pZVar3->n = pZVar3->n - 1;
          if (sVar11 == 0) {
            uVar8 = luaZ_fill(pZVar3);
          }
          else {
            pbVar4 = (byte *)pZVar3->p;
            pZVar3->p = (char *)(pbVar4 + 1);
            uVar8 = (uint)*pbVar4;
          }
          uVar15 = (uVar6 + uVar15 * 10) - 0x30;
          ls->current = uVar8;
          lVar13 = lVar13 + 1;
          uVar6 = uVar8;
        } while (lVar13 != 3);
        lVar13 = 3;
LAB_001152b0:
        if (0xff < (int)uVar15) {
          escerror(ls,(int *)local_44,(int)lVar13,"decimal escape too large");
        }
      }
    }
    else {
      switch(uVar6) {
      case 0x6e:
        uVar15 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x75:
      case 0x77:
      case 0x79:
        goto switchD_0011518c_caseD_6f;
      case 0x72:
        uVar15 = 0xd;
        break;
      case 0x74:
        uVar15 = 9;
        break;
      case 0x76:
        uVar15 = 0xb;
        break;
      case 0x78:
        local_44[0] = 0x78;
        uVar15 = 0;
        lVar13 = 1;
        do {
          pZVar3 = ls->z;
          sVar11 = pZVar3->n;
          pZVar3->n = pZVar3->n - 1;
          if (sVar11 == 0) {
            uVar6 = luaZ_fill(pZVar3);
          }
          else {
            pbVar4 = (byte *)pZVar3->p;
            pZVar3->p = (char *)(pbVar4 + 1);
            uVar6 = (uint)*pbVar4;
          }
          ls->current = uVar6;
          local_44[lVar13] = uVar6;
          if ((""[(long)(int)uVar6 + 1] & 0x10) == 0) {
            escerror(ls,(int *)local_44,(int)lVar13 + 1,"hexadecimal digit expected");
          }
          iVar9 = luaO_hexavalue(uVar6);
          uVar15 = iVar9 + uVar15 * 0x10;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        break;
      case 0x7a:
        goto switchD_0011518c_caseD_7a;
      default:
        if (uVar6 == 0x66) {
          uVar15 = 0xc;
        }
        else {
          if (uVar6 != 0x62) goto switchD_0011518c_caseD_6f;
          uVar15 = 8;
        }
      }
LAB_00115345:
      pZVar3 = ls->z;
      sVar11 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar11 == 0) {
        uVar6 = luaZ_fill(pZVar3);
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar6 = (uint)*pbVar4;
      }
      ls->current = uVar6;
    }
    save(ls,uVar15);
    uVar6 = ls->current;
    goto joined_r0x001150a8;
  }
  save(ls,uVar6);
  pZVar3 = ls->z;
  sVar11 = pZVar3->n;
  pZVar3->n = pZVar3->n - 1;
  if (sVar11 == 0) {
    uVar6 = luaZ_fill(pZVar3);
  }
  else {
    pbVar4 = (byte *)pZVar3->p;
    pZVar3->p = (char *)(pbVar4 + 1);
    uVar6 = (uint)*pbVar4;
  }
  ls->current = uVar6;
  goto joined_r0x001150a8;
switchD_0011518c_caseD_7a:
  do {
    pZVar3 = ls->z;
    sVar11 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar11 == 0) {
      uVar6 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar6 = (uint)*pbVar4;
    }
    ls->current = uVar6;
    while( true ) {
      if ((""[(long)(int)uVar6 + 1] & 8) == 0) goto joined_r0x001150a8;
      if ((uVar6 != 0xd) && (uVar6 != 10)) break;
      inclinenumber(ls);
      uVar6 = ls->current;
    }
  } while( true );
}

Assistant:

static int llex (LexState *ls, SemInfo *seminfo) {
  luaZ_resetbuffer(ls->buff);
  for (;;) {
    switch (ls->current) {
      case '\n': case '\r': {  /* line breaks */
        inclinenumber(ls);
        break;
      }
      case ' ': case '\f': case '\t': case '\v': {  /* spaces */
        next(ls);
        break;
      }
      case '-': {  /* '-' or '--' (comment) */
        next(ls);
        if (ls->current != '-') return '-';
        /* else is a comment */
        next(ls);
        if (ls->current == '[') {  /* long comment? */
          int sep = skip_sep(ls);
          luaZ_resetbuffer(ls->buff);  /* `skip_sep' may dirty the buffer */
          if (sep >= 0) {
            read_long_string(ls, NULL, sep);  /* skip long comment */
            luaZ_resetbuffer(ls->buff);  /* previous call may dirty the buff. */
            break;
          }
        }
        /* else short comment */
        while (!currIsNewline(ls) && ls->current != EOZ)
          next(ls);  /* skip until end of line (or end of file) */
        break;
      }
      case '[': {  /* long string or simply '[' */
        int sep = skip_sep(ls);
        if (sep >= 0) {
          read_long_string(ls, seminfo, sep);
          return TK_STRING;
        }
        else if (sep == -1) return '[';
        else lexerror(ls, "invalid long string delimiter", TK_STRING);
      }
      case '=': {
        next(ls);
        if (ls->current != '=') return '=';
        else { next(ls); return TK_EQ; }
      }
      case '<': {
        next(ls);
        if (ls->current != '=') return '<';
        else { next(ls); return TK_LE; }
      }
      case '>': {
        next(ls);
        if (ls->current != '=') return '>';
        else { next(ls); return TK_GE; }
      }
      case '~': {
        next(ls);
        if (ls->current != '=') return '~';
        else { next(ls); return TK_NE; }
      }
      case ':': {
        next(ls);
        if (ls->current != ':') return ':';
        else { next(ls); return TK_DBCOLON; }
      }
      case '"': case '\'': {  /* short literal strings */
        read_string(ls, ls->current, seminfo);
        return TK_STRING;
      }
      case '.': {  /* '.', '..', '...', or number */
        save_and_next(ls);
        if (check_next(ls, ".")) {
          if (check_next(ls, "."))
            return TK_DOTS;   /* '...' */
          else return TK_CONCAT;   /* '..' */
        }
        else if (!lisdigit(ls->current)) return '.';
        /* else go through */
      }
      case '0': case '1': case '2': case '3': case '4':
      case '5': case '6': case '7': case '8': case '9': {
        read_numeral(ls, seminfo);
        return TK_NUMBER;
      }
      case EOZ: {
        return TK_EOS;
      }
      default: {
        if (lislalpha(ls->current)) {  /* identifier or reserved word? */
          TString *ts;
          do {
            save_and_next(ls);
          } while (lislalnum(ls->current));
          ts = luaX_newstring(ls, luaZ_buffer(ls->buff),
                                  luaZ_bufflen(ls->buff));
          seminfo->ts = ts;
          if (isreserved(ts))  /* reserved word? */
            return ts->tsv.extra - 1 + FIRST_RESERVED;
          else {
            return TK_NAME;
          }
        }
        else {  /* single-char tokens (+ - / ...) */
          int c = ls->current;
          next(ls);
          return c;
        }
      }
    }
  }
}